

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O0

iMultiFab *
amrex::makeFineMask(BoxArray *cba,DistributionMapping *cdm,IntVect *cnghost,BoxArray *fba,
                   IntVect *ratio,Periodicity *period,int crse_value,int fine_value)

{
  iMultiFab *in_RCX;
  BoxArray *in_RDX;
  DistributionMapping *in_RSI;
  MFInfo *in_RDI;
  iMultiFab *mask;
  value_type in_stack_00000250;
  value_type in_stack_00000254;
  Periodicity *in_stack_00000258;
  IntVect *in_stack_00000260;
  BoxArray *in_stack_00000268;
  FabArray<amrex::IArrayBox> *in_stack_00000270;
  DefaultFabFactory<amrex::IArrayBox> *in_stack_ffffffffffffff40;
  IntVect *ngrow;
  MFInfo *pMVar1;
  FabFactory<amrex::IArrayBox> *in_stack_ffffffffffffff80;
  undefined1 local_70 [16];
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined1 local_31;
  int ncomp;
  
  local_31 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_70._8_8_ = 0;
  uStack_60 = 0;
  local_48 = 0;
  pMVar1 = in_RDI;
  MFInfo::MFInfo((MFInfo *)0x12dd3e1);
  ncomp = (int)((ulong)pMVar1 >> 0x20);
  local_70._0_4_ = 0;
  local_70._4_4_ = 0;
  ngrow = (IntVect *)local_70;
  DefaultFabFactory<amrex::IArrayBox>::DefaultFabFactory(in_stack_ffffffffffffff40);
  iMultiFab::iMultiFab(in_RCX,in_RDX,in_RSI,ncomp,ngrow,in_RDI,in_stack_ffffffffffffff80);
  DefaultFabFactory<amrex::IArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::IArrayBox> *)0x12dd433);
  MFInfo::~MFInfo((MFInfo *)0x12dd43d);
  makeFineMask_doit<amrex::IArrayBox>
            (in_stack_00000270,in_stack_00000268,in_stack_00000260,in_stack_00000258,
             in_stack_00000254,in_stack_00000250);
  return (iMultiFab *)in_RDI;
}

Assistant:

iMultiFab makeFineMask (const BoxArray& cba, const DistributionMapping& cdm,
                            const IntVect& cnghost, const BoxArray& fba, const IntVect& ratio,
                            Periodicity const& period, int crse_value, int fine_value)
    {
        iMultiFab mask(cba, cdm, 1, cnghost);
        makeFineMask_doit(mask, fba, ratio, period, crse_value, fine_value);
        return mask;
    }